

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float64 float64_add_arm(float64 a,float64 b,float_status *s)

{
  _Bool _Var1;
  int iVar2;
  float64 fVar3;
  double dVar4;
  
  if (((s->float_exception_flags & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    if (s->flush_inputs_to_zero != '\0') {
      if ((a & 0x7fffffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0) {
        a = a & 0x8000000000000000;
        s->float_exception_flags = s->float_exception_flags | 0x40;
      }
      if ((b & 0x7fffffffffffffff) != 0 && (b & 0x7ff0000000000000) == 0) {
        b = b & 0x8000000000000000;
        s->float_exception_flags = s->float_exception_flags | 0x40;
      }
    }
    iVar2 = __fpclassify((double)a);
    if ((iVar2 == 4) || (iVar2 == 2)) {
      iVar2 = __fpclassify((double)b);
      if ((iVar2 == 4) || (iVar2 == 2)) {
        dVar4 = (double)a + (double)b;
        if (ABS(dVar4) == INFINITY) {
          s->float_exception_flags = s->float_exception_flags | 8;
        }
        else if (ABS(dVar4) <= 2.2250738585072014e-308) {
          _Var1 = f64_addsub_post((union_float64)a,(union_float64)b);
          if (_Var1) goto LAB_00554ead;
        }
        return (float64)dVar4;
      }
    }
  }
LAB_00554ead:
  fVar3 = soft_f64_addsub(a,b,false,s);
  return fVar3;
}

Assistant:

float64 QEMU_FLATTEN
float64_add(float64 a, float64 b, float_status *s)
{
    return float64_addsub(a, b, s, hard_f64_add, soft_f64_add);
}